

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE.c
# Opt level: O3

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                   char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  asn_TYPE_member_s *paVar2;
  int *piVar3;
  asn_TYPE_member_s *paVar4;
  short sVar5;
  ssize_t sVar7;
  xer_check_tag_e tcv;
  int iVar6;
  asn_dec_rval_t aVar14;
  undefined8 *****pppppuVar8;
  undefined8 *****pppppuVar9;
  long extraout_RDX;
  size_t num_1;
  size_t sVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  pxer_chunk_type_e ch_type;
  void *memb_ptr;
  pxer_chunk_type_e local_64;
  char *local_60;
  ber_tlv_len_t *local_58;
  void *local_50;
  asn_codec_ctx_t *local_48;
  int *local_40;
  undefined8 ****local_38;
  
  local_60 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_60 = td->xml_tag;
  }
  paVar2 = td->elements;
  piVar3 = (int *)td->specifics;
  local_50 = *struct_ptr;
  local_48 = opt_codec_ctx;
  if (local_50 == (void *)0x0) {
    local_50 = calloc(1,(long)*piVar3);
    *struct_ptr = local_50;
    if (local_50 == (void *)0x0) {
      uVar13 = 2;
      sVar10 = 0;
      goto LAB_00143de5;
    }
  }
  psVar1 = (short *)((long)local_50 + (long)piVar3[1]);
  sVar5 = *(short *)((long)local_50 + (long)piVar3[1]);
  if (sVar5 < 4) {
    iVar11 = (int)psVar1[1];
    local_40 = (int *)(psVar1 + 2);
    local_58 = (ber_tlv_len_t *)(psVar1 + 8);
    sVar10 = 0;
    do {
      if (sVar5 == 2) {
        paVar4 = td->elements;
        pppppuVar8 = (undefined8 *****)((long)paVar4[iVar11].memb_offset + (long)local_50);
        pppppuVar9 = pppppuVar8;
        if ((paVar4[iVar11].flags & ATF_POINTER) == ATF_NOFLAGS) {
          pppppuVar9 = &local_38;
          local_38 = pppppuVar8;
        }
        aVar14.code = (*(paVar4[iVar11].type)->xer_decoder)
                                (local_48,paVar4[iVar11].type,pppppuVar9,paVar4[iVar11].name,buf_ptr
                                 ,size);
        sVar10 = sVar10 + extraout_RDX;
        if (aVar14.code != (asn_dec_rval_t)0x0) {
          uVar13 = (ulong)(uint)aVar14.code;
          goto LAB_00143de5;
        }
        size = size - extraout_RDX;
        buf_ptr = (void *)((long)buf_ptr + extraout_RDX);
        *psVar1 = 1;
        iVar11 = iVar11 + 1;
        psVar1[1] = (short)iVar11;
      }
      sVar7 = xer_next_token(local_40,buf_ptr,size,&local_64);
      uVar13 = 2;
      if (sVar7 == -1) goto LAB_00143de5;
      if (local_64 - PXER_TEXT < 2) goto LAB_00143b6f;
      if (local_64 == PXER_WMORE) {
        uVar13 = 1;
        goto LAB_00143de5;
      }
      tcv = xer_check_tag(buf_ptr,(int)sVar7,local_60);
      if (*psVar1 != 3) goto switchD_00143bc0_default;
      iVar6 = xer_skip_unknown(tcv,local_58);
      switch(iVar6) {
      case 0:
        break;
      case 1:
        *psVar1 = 1;
        break;
      case 2:
        *psVar1 = 1;
      default:
switchD_00143bc0_default:
        switch(tcv) {
        case XCT_OPENING:
          sVar5 = *psVar1;
          if (sVar5 != 0) goto LAB_00143c4e;
          *psVar1 = 1;
          goto LAB_00143dc2;
        case XCT_CLOSING:
          if (*psVar1 != 0) {
            *psVar1 = 0;
LAB_00143e26:
            iVar6 = td->elements_count;
            if (((iVar6 <= iVar11) || (paVar2[iVar11].optional + iVar11 == iVar6)) ||
               ((piVar3[10] < iVar11 && (iVar6 < piVar3[0xb])))) {
              sVar10 = sVar10 + sVar7;
              *psVar1 = 4;
              uVar13 = 0;
            }
            goto LAB_00143de5;
          }
          break;
        case XCT_BOTH:
          sVar5 = *psVar1;
          if (sVar5 == 0) goto LAB_00143e26;
          goto LAB_00143c4e;
        case XCT_UNKNOWN_OP:
        case XCT_UNKNOWN_BO:
          sVar5 = *psVar1;
LAB_00143c4e:
          if (sVar5 != 1) break;
          iVar6 = td->elements_count;
          if (iVar6 <= iVar11) {
LAB_00143d4c:
            if (iVar11 < td->elements_count) {
              iVar6 = paVar2[iVar11].optional;
              if (piVar3[10] < iVar6 + iVar11) {
LAB_00143d8b:
                if (iVar6 + iVar11 < piVar3[0xb]) {
                  if ((tcv & XCT_CLOSING) == XCT_BROKEN) {
                    psVar1[8] = 1;
                    psVar1[9] = 0;
                    psVar1[10] = 0;
                    psVar1[0xb] = 0;
                    *psVar1 = 3;
                  }
LAB_00143dc2:
                  size = size - sVar7;
                  buf_ptr = (void *)((long)buf_ptr + sVar7);
                  sVar10 = sVar10 + sVar7;
                  goto LAB_00143dc7;
                }
              }
            }
            else {
              iVar6 = 0;
              if (piVar3[10] < iVar11) goto LAB_00143d8b;
            }
            break;
          }
          iVar12 = paVar2[iVar11].optional + iVar11 + 1;
          if (iVar6 <= paVar2[iVar11].optional + iVar11) {
            iVar12 = iVar6;
          }
          iVar6 = iVar11;
          if (iVar11 < iVar12) {
            uVar13 = (long)iVar11 * 0x40 | 0x38;
LAB_00143c9f:
            tcv = xer_check_tag(buf_ptr,(int)sVar7,*(char **)((long)&td->elements->flags + uVar13));
            switch(tcv) {
            case XCT_OPENING:
            case XCT_BOTH:
              psVar1[1] = (short)iVar6;
              *psVar1 = 2;
              break;
            default:
              goto LAB_00143d4c;
            case XCT_UNKNOWN_OP:
            case XCT_UNKNOWN_BO:
              goto switchD_00143cd1_caseD_5;
            }
          }
          iVar11 = iVar6;
          if (iVar6 == iVar12) goto LAB_00143d4c;
          goto LAB_00143dc7;
        }
        goto LAB_00143dd9;
      case -1:
        *psVar1 = 4;
        goto LAB_00143de5;
      }
LAB_00143b6f:
      size = size - sVar7;
      buf_ptr = (void *)((long)buf_ptr + sVar7);
      sVar10 = sVar10 + sVar7;
LAB_00143dc7:
      sVar5 = *psVar1;
    } while (sVar5 < 4);
  }
  else {
    sVar10 = 0;
  }
LAB_00143dd9:
  *psVar1 = 4;
  uVar13 = 2;
LAB_00143de5:
  aVar14.consumed = sVar10;
  aVar14._0_8_ = uVar13;
  return aVar14;
switchD_00143cd1_caseD_5:
  iVar6 = iVar6 + 1;
  uVar13 = uVar13 + 0x40;
  if (iVar12 == iVar6) goto LAB_00143d4c;
  goto LAB_00143c9f;
}

Assistant:

asn_dec_rval_t
SEQUENCE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SEQUENCE_specifics_t *specs
		= (asn_SEQUENCE_specifics_t *)td->specifics;
	asn_TYPE_member_t *elements = td->elements;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */
	int edx_end;

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);


	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Skipping unknown extensions.
	 * Phase 4: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 3;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;
		int n;

		/*
		 * Go inside the inner member of a sequence.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st + elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Invoke the inner type decoder, m.b. multiple times */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			ctx->phase = 1;	/* Back to body processing */
			ctx->step = ++edx;
			ASN_DEBUG("XER/SEQUENCE phase => %d, step => %d",
				ctx->phase, ctx->step);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size,
			&ch_type);
		if(ch_size == -1) {
		    RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SEQUENCE: tcv = %d, ph=%d [%s]",
			tcv, ctx->phase, xml_tag);

		/* Skip the extensions section */
		if(ctx->phase == 3) {
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 4;
				RETURN(RC_FAIL);
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 1:
				XER_ADVANCE(ch_size);
				ctx->phase = 1;
				continue;
			case 2:
				ctx->phase = 1;
				break;
			}
		}

		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				if(edx >= td->elements_count
				   ||
				   /* Explicit OPTIONAL specs reaches the end */
				    (edx + elements[edx].optional
					== td->elements_count)
				   ||
				   /* All extensions are optional */
				   (IN_EXTENSION_GROUP(specs, edx)
					&& specs->ext_before
						> td->elements_count)
				) {
					XER_ADVANCE(ch_size);
					ctx->phase = 4;	/* Phase out */
					RETURN(RC_OK);
				} else {
					ASN_DEBUG("Premature end of XER SEQUENCE");
					RETURN(RC_FAIL);
				}
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SEQUENCE: tcv=%d, ph=%d, edx=%d",
				tcv, ctx->phase, edx);
			if(ctx->phase != 1) {
				break;	/* Really unexpected */
			}

			if(edx < td->elements_count) {
				/*
				 * Search which member corresponds to this tag.
				 */
				edx_end = edx + elements[edx].optional + 1;
				if(edx_end > td->elements_count)
					edx_end = td->elements_count;
				for(n = edx; n < edx_end; n++) {
					elm = &td->elements[n];
					tcv = xer_check_tag(buf_ptr,
						ch_size, elm->name);
					switch(tcv) {
					case XCT_BOTH:
					case XCT_OPENING:
						/*
						 * Process this member.
						 */
						ctx->step = edx = n;
						ctx->phase = 2;
						break;
					case XCT_UNKNOWN_OP:
					case XCT_UNKNOWN_BO:
						continue;
					default:
						n = edx_end;
						break;	/* Phase out */
					}
					break;
				}
				if(n != edx_end)
					continue;
			} else {
				ASN_DEBUG("Out of defined members: %d/%d",
					edx, td->elements_count);
			}

			/* It is expected extension */
			if(IN_EXTENSION_GROUP(specs,
				edx + (edx < td->elements_count
					? elements[edx].optional : 0))) {
				ASN_DEBUG("Got anticipated extension at %d",
					edx);
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
				} else {
					ctx->left = 1;
					ctx->phase = 3;	/* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SEQUENCE [%c%c%c%c%c%c]",
			size>0?((const char *)buf_ptr)[0]:'.',
			size>1?((const char *)buf_ptr)[1]:'.',
			size>2?((const char *)buf_ptr)[2]:'.',
			size>3?((const char *)buf_ptr)[3]:'.',
			size>4?((const char *)buf_ptr)[4]:'.',
			size>5?((const char *)buf_ptr)[5]:'.');
		break;
	}

	ctx->phase = 4;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}